

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O2

void duckdb::ReadCSVTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  FunctionSet<duckdb::TableFunction> local_3f0;
  FunctionSet<duckdb::TableFunction> local_3b8;
  TableFunction local_380;
  TableFunction local_1c8;
  
  GetFunction();
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_3b8,&local_1c8);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_3b8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_3b8);
  TableFunction::~TableFunction(&local_1c8);
  GetAutoFunction();
  MultiFileReader::CreateFunctionSet((TableFunctionSet *)&local_3f0,&local_380);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_3f0);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_3f0);
  TableFunction::~TableFunction(&local_380);
  return;
}

Assistant:

void ReadCSVTableFunction::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(MultiFileReader::CreateFunctionSet(ReadCSVTableFunction::GetFunction()));
	set.AddFunction(MultiFileReader::CreateFunctionSet(ReadCSVTableFunction::GetAutoFunction()));
}